

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::analyze_parameter_preservation
          (Compiler *this,SPIRFunction *entry,CFG *cfg,
          unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *variable_to_blocks,
          unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *complete_write_blocks)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  bool bVar5;
  SPIRType *pSVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  _Hash_node_base *p_Var9;
  Parameter *pPVar10;
  __node_base_ptr p_Var11;
  Parameter *pPVar12;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  visit_cache;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  sVar2 = (entry->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  if (sVar2 != 0) {
    pPVar10 = (entry->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    pPVar12 = pPVar10 + sVar2;
    do {
      pSVar6 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (pPVar10->type).id);
      if ((pSVar6->pointer == true) &&
         ((Sampler < pSVar6->basetype ||
          ((0x70800U >> (pSVar6->basetype & (Image|Struct)) & 1) == 0)))) {
        uVar1 = (pPVar10->id).id;
        uVar3 = (variable_to_blocks->_M_h)._M_bucket_count;
        uVar8 = (ulong)uVar1 % uVar3;
        p_Var4 = (variable_to_blocks->_M_h)._M_buckets[uVar8];
        p_Var7 = (__node_base_ptr)0x0;
        if ((p_Var4 != (__node_base_ptr)0x0) &&
           (p_Var7 = p_Var4, p_Var11 = p_Var4->_M_nxt, uVar1 != *(uint *)&p_Var4->_M_nxt[1]._M_nxt))
        {
          while (p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
            p_Var7 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar3 != uVar8) ||
               (p_Var7 = p_Var11, p_Var11 = p_Var9, uVar1 == *(uint *)&p_Var9[1]._M_nxt))
            goto LAB_00396c91;
          }
          p_Var7 = (__node_base_ptr)0x0;
        }
LAB_00396c91:
        if ((p_Var7 != (__node_base_ptr)0x0) && (p_Var7->_M_nxt != (_Hash_node_base *)0x0)) {
          uVar3 = (complete_write_blocks->_M_h)._M_bucket_count;
          uVar8 = (ulong)uVar1 % uVar3;
          p_Var4 = (complete_write_blocks->_M_h)._M_buckets[uVar8];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var4 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var4, p_Var11 = p_Var4->_M_nxt, uVar1 != *(uint *)&p_Var4->_M_nxt[1]._M_nxt
             )) {
            while (p_Var9 = p_Var11->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar3 != uVar8) ||
                 (p_Var7 = p_Var11, p_Var11 = p_Var9, uVar1 == *(uint *)&p_Var9[1]._M_nxt))
              goto LAB_00396cf9;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_00396cf9:
          if (p_Var7 == (__node_base_ptr)0x0) {
            p_Var9 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var9 = p_Var7->_M_nxt;
          }
          if (p_Var9 == (_Hash_node_base *)0x0) {
            pPVar10->read_count = pPVar10->read_count + 1;
          }
          else {
            local_68._M_buckets = &local_68._M_single_bucket;
            local_68._M_bucket_count = 1;
            local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_68._M_element_count = 0;
            local_68._M_rehash_policy._M_max_load_factor = 1.0;
            local_68._M_rehash_policy._M_next_resize = 0;
            local_68._M_single_bucket = (__node_base_ptr)0x0;
            bVar5 = exists_unaccessed_path_to_return
                              (cfg,(entry->entry_block).id,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)(p_Var9 + 2),
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&local_68);
            if (bVar5) {
              pPVar10->read_count = pPVar10->read_count + 1;
            }
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_68);
          }
        }
      }
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 != pPVar12);
  }
  return;
}

Assistant:

void Compiler::analyze_parameter_preservation(
    SPIRFunction &entry, const CFG &cfg, const unordered_map<uint32_t, unordered_set<uint32_t>> &variable_to_blocks,
    const unordered_map<uint32_t, unordered_set<uint32_t>> &complete_write_blocks)
{
	for (auto &arg : entry.arguments)
	{
		// Non-pointers are always inputs.
		auto &type = get<SPIRType>(arg.type);
		if (!type.pointer)
			continue;

		// Opaque argument types are always in
		bool potential_preserve;
		switch (type.basetype)
		{
		case SPIRType::Sampler:
		case SPIRType::Image:
		case SPIRType::SampledImage:
		case SPIRType::AtomicCounter:
			potential_preserve = false;
			break;

		default:
			potential_preserve = true;
			break;
		}

		if (!potential_preserve)
			continue;

		auto itr = variable_to_blocks.find(arg.id);
		if (itr == end(variable_to_blocks))
		{
			// Variable is never accessed.
			continue;
		}

		// We have accessed a variable, but there was no complete writes to that variable.
		// We deduce that we must preserve the argument.
		itr = complete_write_blocks.find(arg.id);
		if (itr == end(complete_write_blocks))
		{
			arg.read_count++;
			continue;
		}

		// If there is a path through the CFG where no block completely writes to the variable, the variable will be in an undefined state
		// when the function returns. We therefore need to implicitly preserve the variable in case there are writers in the function.
		// Major case here is if a function is
		// void foo(int &var) { if (cond) var = 10; }
		// Using read/write counts, we will think it's just an out variable, but it really needs to be inout,
		// because if we don't write anything whatever we put into the function must return back to the caller.
		unordered_set<uint32_t> visit_cache;
		if (exists_unaccessed_path_to_return(cfg, entry.entry_block, itr->second, visit_cache))
			arg.read_count++;
	}
}